

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBase.hpp
# Opt level: O1

void __thiscall
Diligent::BufferBase<Diligent::EngineVkImplTraits>::~BufferBase
          (BufferBase<Diligent::EngineVkImplTraits> *this)

{
  BufferViewVkImpl *pBVar1;
  
  (this->
  super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>).
  super_ObjectBase<Diligent::IBufferVk>.super_RefCountedObject<Diligent::IBufferVk>.super_IBufferVk.
  super_IBuffer.super_IDeviceObject.super_IObject = (IObject)&PTR_QueryInterface_00b01e78;
  if (this->m_DynamicBufferId != 0xffffffff) {
    RenderDeviceBase<Diligent::EngineVkImplTraits>::RecycleDynamicBufferId
              ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)
               (this->
               super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
               ).m_pDevice,this->m_DynamicBufferId);
  }
  pBVar1 = (this->m_pDefaultSRV)._M_t.
           super___uniq_ptr_impl<Diligent::BufferViewVkImpl,_Diligent::STDDeleter<Diligent::BufferViewVkImpl,_Diligent::FixedBlockMemoryAllocator>_>
           ._M_t.
           super__Tuple_impl<0UL,_Diligent::BufferViewVkImpl_*,_Diligent::STDDeleter<Diligent::BufferViewVkImpl,_Diligent::FixedBlockMemoryAllocator>_>
           .super__Head_base<0UL,_Diligent::BufferViewVkImpl_*,_false>._M_head_impl;
  if (pBVar1 != (BufferViewVkImpl *)0x0) {
    STDDeleter<Diligent::BufferViewVkImpl,_Diligent::FixedBlockMemoryAllocator>::operator()
              ((STDDeleter<Diligent::BufferViewVkImpl,_Diligent::FixedBlockMemoryAllocator> *)
               &this->m_pDefaultSRV,pBVar1);
  }
  (this->m_pDefaultSRV)._M_t.
  super___uniq_ptr_impl<Diligent::BufferViewVkImpl,_Diligent::STDDeleter<Diligent::BufferViewVkImpl,_Diligent::FixedBlockMemoryAllocator>_>
  ._M_t.
  super__Tuple_impl<0UL,_Diligent::BufferViewVkImpl_*,_Diligent::STDDeleter<Diligent::BufferViewVkImpl,_Diligent::FixedBlockMemoryAllocator>_>
  .super__Head_base<0UL,_Diligent::BufferViewVkImpl_*,_false>._M_head_impl = (BufferViewVkImpl *)0x0
  ;
  pBVar1 = (this->m_pDefaultUAV)._M_t.
           super___uniq_ptr_impl<Diligent::BufferViewVkImpl,_Diligent::STDDeleter<Diligent::BufferViewVkImpl,_Diligent::FixedBlockMemoryAllocator>_>
           ._M_t.
           super__Tuple_impl<0UL,_Diligent::BufferViewVkImpl_*,_Diligent::STDDeleter<Diligent::BufferViewVkImpl,_Diligent::FixedBlockMemoryAllocator>_>
           .super__Head_base<0UL,_Diligent::BufferViewVkImpl_*,_false>._M_head_impl;
  if (pBVar1 != (BufferViewVkImpl *)0x0) {
    STDDeleter<Diligent::BufferViewVkImpl,_Diligent::FixedBlockMemoryAllocator>::operator()
              ((STDDeleter<Diligent::BufferViewVkImpl,_Diligent::FixedBlockMemoryAllocator> *)
               &this->m_pDefaultUAV,pBVar1);
  }
  (this->m_pDefaultUAV)._M_t.
  super___uniq_ptr_impl<Diligent::BufferViewVkImpl,_Diligent::STDDeleter<Diligent::BufferViewVkImpl,_Diligent::FixedBlockMemoryAllocator>_>
  ._M_t.
  super__Tuple_impl<0UL,_Diligent::BufferViewVkImpl_*,_Diligent::STDDeleter<Diligent::BufferViewVkImpl,_Diligent::FixedBlockMemoryAllocator>_>
  .super__Head_base<0UL,_Diligent::BufferViewVkImpl_*,_false>._M_head_impl = (BufferViewVkImpl *)0x0
  ;
  DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>::
  ~DeviceObjectBase(&this->
                     super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                   );
  return;
}

Assistant:

~BufferBase()
    {
        if (m_DynamicBufferId != ~0u)
        {
            this->m_pDevice->RecycleDynamicBufferId(m_DynamicBufferId);
        }
    }